

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

CAmount __thiscall wallet::CWallet::GetDebit(CWallet *this,CTxIn *txin,isminefilter *filter)

{
  long lVar1;
  long lVar2;
  isminetype iVar3;
  const_iterator cVar4;
  ulong uVar5;
  CAmount CVar6;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock31;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock31,&this->cs_wallet,"cs_wallet",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.cpp"
             ,0x638,false);
  cVar4 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->mapWallet)._M_h,(key_type *)txin);
  if (cVar4.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur !=
      (__node_type *)0x0) {
    uVar5 = (ulong)(txin->prevout).n;
    lVar2 = *(long *)(*(long *)((long)cVar4.
                                      super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                      ._M_cur + 0x1c0) + 0x18);
    if (uVar5 < (ulong)((*(long *)(*(long *)((long)cVar4.
                                                  super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                                  ._M_cur + 0x1c0) + 0x20) - lVar2) / 0x28)) {
      iVar3 = IsMine(this,(CScript *)(lVar2 + uVar5 * 0x28 + 8));
      if ((*filter & iVar3) != ISMINE_NO) {
        CVar6 = *(CAmount *)
                 (*(long *)(*(long *)((long)cVar4.
                                            super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                            ._M_cur + 0x1c0) + 0x18) +
                 (ulong)(txin->prevout).n * 0x28);
        goto LAB_009a3d29;
      }
    }
  }
  CVar6 = 0;
LAB_009a3d29:
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock31.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return CVar6;
  }
  __stack_chk_fail();
}

Assistant:

CAmount CWallet::GetDebit(const CTxIn &txin, const isminefilter& filter) const
{
    {
        LOCK(cs_wallet);
        const auto mi = mapWallet.find(txin.prevout.hash);
        if (mi != mapWallet.end())
        {
            const CWalletTx& prev = (*mi).second;
            if (txin.prevout.n < prev.tx->vout.size())
                if (IsMine(prev.tx->vout[txin.prevout.n]) & filter)
                    return prev.tx->vout[txin.prevout.n].nValue;
        }
    }
    return 0;
}